

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.cpp
# Opt level: O3

void __thiscall Mond::Visitor::Visit(Visitor *this,StmtWhile *stmt)

{
  element_type *peVar1;
  element_type *peVar2;
  
  (*this->_vptr_Visitor[2])();
  peVar1 = (stmt->cond).super___shared_ptr<Mond::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    (*(peVar1->super_AstNode)._vptr_AstNode[2])(peVar1,this);
  }
  peVar2 = (stmt->body).super___shared_ptr<Mond::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    (*(peVar2->super_AstNode)._vptr_AstNode[2])(peVar2,this);
    return;
  }
  return;
}

Assistant:

void Visitor::Visit(StmtWhile *stmt)
{
	VisitSelf(this, stmt);
	AcceptChild(this, stmt->cond.get());
	AcceptChild(this, stmt->body.get());
}